

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O2

void dtl_json_reader_close(void *arg)

{
  uint uVar1;
  uint8_t *pBegin;
  uint8_t *puVar2;
  dtl_json_reader_t *self;
  
  if (arg != (void *)0x0) {
    pBegin = (uint8_t *)adt_bytearray_data((long)arg + 0x20);
    uVar1 = adt_bytearray_length((long)arg + 0x20);
    if ((pBegin != (uint8_t *)0x0) &&
       (puVar2 = dtl_json_reader_parse_block((dtl_json_reader_t *)arg,pBegin,pBegin + uVar1),
       puVar2 == pBegin + uVar1)) {
      *(undefined1 *)((long)arg + 0x49) = 1;
    }
  }
  return;
}

Assistant:

static void dtl_json_reader_close(void *arg)
{
   dtl_json_reader_t *self = (dtl_json_reader_t*) arg;
   if (self != 0)
   {
      const uint8_t *pBegin;
      const uint8_t *pEnd;
      pBegin = adt_bytearray_data(&self->parseBuf);
      pEnd = pBegin + adt_bytearray_length(&self->parseBuf);
      if ( (pBegin != 0) && (pEnd != 0) )
      {
         const uint8_t *pResult = dtl_json_reader_parse_block(self, pBegin, pEnd);
         if (pResult == pEnd)
         {
            self->parseComplete = true;
         }
      }
   }
}